

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O0

bool __thiscall
acto::actor_ref::send_message_on_behalf
          (actor_ref *this,object_t *sender,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  object_t *target;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *sender_00;
  bool bVar1;
  runtime_t *this_00;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_28;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *local_20;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  object_t *sender_local;
  actor_ref *this_local;
  
  local_20 = msg;
  msg_local = (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)sender;
  sender_local = (object_t *)this;
  this_00 = core::runtime_t::instance();
  sender_00 = msg_local;
  target = this->object_;
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
            (&local_28,msg);
  bVar1 = core::runtime_t::send_on_behalf(this_00,target,(object_t *)sender_00,&local_28);
  std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
            (&local_28);
  return bVar1;
}

Assistant:

bool actor_ref::send_message_on_behalf(core::object_t* sender,
                                       std::unique_ptr<core::msg_t> msg) const {
  return core::runtime_t::instance()->send_on_behalf(object_, sender,
                                                     std::move(msg));
}